

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iuutil::CmpHelperEqIterator<int_const*,int_const*>
          (AssertionResult *__return_storage_ptr__,iuutil *this,int *b1,int *e1,int *b2,int *e2)

{
  int *expected;
  iuutil *v;
  bool bVar1;
  undefined8 extraout_RAX;
  iuStreamMessage *piVar2;
  AssertionResult *rhs;
  AssertionResult *pAVar3;
  long lVar4;
  Message ar;
  int local_248;
  uint local_244;
  int *local_240;
  AssertionResult *local_238;
  iuutil *local_230;
  AssertionResult local_228;
  long local_200;
  long local_1f8;
  iuutil *local_1f0;
  int *local_1e8;
  AssertionResult local_1e0;
  iuStreamMessage local_1b8;
  
  local_238 = __return_storage_ptr__;
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1b8.m_stream);
  local_1f8 = (long)b1 - (long)this;
  local_200 = (long)b2 - (long)e1;
  local_244 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  lVar4 = 0;
  local_248 = 0;
  local_240 = b2;
  local_230 = (iuutil *)b1;
  local_1f0 = this;
  local_1e8 = e1;
  while( true ) {
    expected = (int *)((long)local_1e8 + lVar4);
    v = local_1f0 + lVar4;
    if ((v == local_230) || (expected == local_240)) break;
    iutest::internal::CmpHelperEQ<int,int>(&local_1e0,(internal *)0x313eeb,"",(char *)v,expected,e2)
    ;
    iutest::AssertionResult::operator!(&local_228,&local_1e0);
    bVar1 = local_228.m_result;
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_1e0);
    if (bVar1 == true) {
      piVar2 = iutest::detail::iuStreamMessage::operator<<
                         (&local_1b8,(char (*) [25])"\nMismatch in a position ");
      piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,&local_248);
      piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(char (*) [3])0x314bf0);
      iutest::PrintToString<int>(&local_228.m_message,(int *)v);
      piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,&local_228.m_message);
      piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(char (*) [5])" vs ");
      iutest::PrintToString<int>(&local_1e0.m_message,expected);
      iutest::detail::iuStreamMessage::operator<<(piVar2,&local_1e0.m_message);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_228);
      local_244 = 0;
    }
    local_248 = local_248 + 1;
    lVar4 = lVar4 + 4;
  }
  if (v == local_230) {
    if (expected != local_240) goto LAB_002bdc85;
    if ((local_244 & 1) != 0) {
      (local_238->m_message)._M_dataplus._M_p = (pointer)&(local_238->m_message).field_2;
      (local_238->m_message)._M_string_length = 0;
      (local_238->m_message).field_2._M_local_buf[0] = '\0';
      local_238->m_result = true;
      pAVar3 = local_238;
      goto LAB_002bdd14;
    }
  }
  else {
    local_228.m_message._M_dataplus._M_p._0_4_ = local_248 + (int)((ulong)(local_1f8 - lVar4) >> 2);
    piVar2 = iutest::detail::iuStreamMessage::operator<<
                       (&local_1b8,(char (*) [21])"\nMismatch element : ");
    piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(int *)&local_228);
    piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(char (*) [5])" vs ");
    iutest::detail::iuStreamMessage::operator<<(piVar2,&local_248);
    if (expected != local_240) {
LAB_002bdc85:
      local_228.m_message._M_dataplus._M_p._0_4_ =
           (int)((ulong)(local_200 - lVar4) >> 2) + local_248;
      piVar2 = iutest::detail::iuStreamMessage::operator<<
                         (&local_1b8,(char (*) [21])"\nMismatch element : ");
      piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,&local_248);
      piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(char (*) [5])" vs ");
      iutest::detail::iuStreamMessage::operator<<(piVar2,(int *)&local_228);
    }
  }
  local_228.m_message._M_dataplus._M_p = (pointer)&local_228.m_message.field_2;
  local_228.m_message._M_string_length = 0;
  local_228.m_message.field_2._M_local_buf[0] = '\0';
  local_228.m_result = false;
  rhs = iutest::AssertionResult::operator<<(&local_228,&local_1b8);
  pAVar3 = local_238;
  iutest::AssertionResult::AssertionResult(local_238,rhs);
  std::__cxx11::string::~string((string *)&local_228);
LAB_002bdd14:
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1b8.m_stream);
  return pAVar3;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperEqIterator(T1 b1, T1 e1, T2 b2, T2 e2)
{
    int elem=0;
    bool result = true;
    ::iutest::Message ar;
    for(elem=0; b1 != e1 && b2 != e2; ++b1, ++b2, ++elem)
    {
        if(!::iutest::internal::backward::EqHelper<false>::Compare("", "", *b1, *b2))
        {
            result = false;
            ar << "\nMismatch in a position " << elem << ": "
                << ::iutest::internal::FormatForComparisonFailureMessage(*b1, *b2)
                << " vs " << ::iutest::internal::FormatForComparisonFailureMessage(*b2, *b1);
        }
    }
    if(b1 != e1)
    {
        int elem1 = elem;
        for(; b1 != e1; ++b1, ++elem1) {}
        result = false;
        ar << "\nMismatch element : " << elem1 << " vs " << elem;
    }
    if(b2 != e2)
    {
        int elem2 = elem;
        for(; b2 != e2; ++b2, ++elem2) {}
        result = false;
        ar << "\nMismatch element : " << elem << " vs " << elem2;
    }
    if( !result )
    {
        return ::iutest::AssertionFailure() << ar;
    }
    return ::iutest::AssertionSuccess();
}